

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

WebPMuxError CreateFrameData(int width,int height,WebPMuxFrameInfo *info,WebPData *frame)

{
  byte bVar1;
  uint8_t *data;
  void *pvVar2;
  undefined8 *in_RCX;
  long in_RDX;
  size_t frame_size;
  uint8_t *frame_bytes;
  int in_stack_ffffffffffffffcc;
  uint64_t in_stack_ffffffffffffffd8;
  WebPMuxError local_4;
  
  data = (uint8_t *)0x10;
  pvVar2 = WebPSafeMalloc(in_stack_ffffffffffffffd8,0x10);
  if (pvVar2 == (void *)0x0) {
    local_4 = WEBP_MUX_MEMORY_ERROR;
  }
  else {
    PutLE24(data,in_stack_ffffffffffffffcc);
    PutLE24(data,in_stack_ffffffffffffffcc);
    PutLE24(data,in_stack_ffffffffffffffcc);
    PutLE24(data,in_stack_ffffffffffffffcc);
    PutLE24(data,in_stack_ffffffffffffffcc);
    bVar1 = 0;
    if (*(int *)(in_RDX + 0x24) == 1) {
      bVar1 = 2;
    }
    *(byte *)((long)pvVar2 + 0xf) = bVar1 | *(int *)(in_RDX + 0x20) == 1;
    *in_RCX = pvVar2;
    in_RCX[1] = data;
    local_4 = WEBP_MUX_OK;
  }
  return local_4;
}

Assistant:

static WebPMuxError CreateFrameData(
    int width, int height, const WebPMuxFrameInfo* const info,
    WebPData* const frame) {
  uint8_t* frame_bytes;
  const size_t frame_size = kChunks[IDX_ANMF].size;

  assert(width > 0 && height > 0 && info->duration >= 0);
  assert(info->dispose_method == (info->dispose_method & 1));
  // Note: assertion on upper bounds is done in PutLE24().

  frame_bytes = (uint8_t*)WebPSafeMalloc(1ULL, frame_size);
  if (frame_bytes == NULL) return WEBP_MUX_MEMORY_ERROR;

  PutLE24(frame_bytes + 0, info->x_offset / 2);
  PutLE24(frame_bytes + 3, info->y_offset / 2);

  PutLE24(frame_bytes + 6, width - 1);
  PutLE24(frame_bytes + 9, height - 1);
  PutLE24(frame_bytes + 12, info->duration);
  frame_bytes[15] =
      (info->blend_method == WEBP_MUX_NO_BLEND ? 2 : 0) |
      (info->dispose_method == WEBP_MUX_DISPOSE_BACKGROUND ? 1 : 0);

  frame->bytes = frame_bytes;
  frame->size = frame_size;
  return WEBP_MUX_OK;
}